

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O0

void __thiscall
icu_63::ThaiBreakEngine::ThaiBreakEngine
          (ThaiBreakEngine *this,DictionaryMatcher *adoptDictionary,UErrorCode *status)

{
  UBool UVar1;
  ConstChar16Ptr local_c0;
  UnicodeString local_b8;
  ConstChar16Ptr local_78;
  UnicodeString local_70;
  UErrorCode *local_20;
  UErrorCode *status_local;
  DictionaryMatcher *adoptDictionary_local;
  ThaiBreakEngine *this_local;
  
  local_20 = status;
  status_local = (UErrorCode *)adoptDictionary;
  adoptDictionary_local = (DictionaryMatcher *)this;
  DictionaryBreakEngine::DictionaryBreakEngine(&this->super_DictionaryBreakEngine);
  (this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine =
       (_func_int **)&PTR__ThaiBreakEngine_004aab90;
  UnicodeSet::UnicodeSet(&this->fThaiWordSet);
  UnicodeSet::UnicodeSet(&this->fEndWordSet);
  UnicodeSet::UnicodeSet(&this->fBeginWordSet);
  UnicodeSet::UnicodeSet(&this->fSuffixSet);
  UnicodeSet::UnicodeSet(&this->fMarkSet);
  this->fDictionary = (DictionaryMatcher *)status_local;
  ConstChar16Ptr::ConstChar16Ptr(&local_78,L"[[:Thai:]&[:LineBreak=SA:]]");
  UnicodeString::UnicodeString(&local_70,'\x01',&local_78,-1);
  UnicodeSet::applyPattern(&this->fThaiWordSet,&local_70,local_20);
  UnicodeString::~UnicodeString(&local_70);
  ConstChar16Ptr::~ConstChar16Ptr(&local_78);
  UVar1 = ::U_SUCCESS(*local_20);
  if (UVar1 != '\0') {
    (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
              (this,&this->fThaiWordSet);
  }
  ConstChar16Ptr::ConstChar16Ptr(&local_c0,L"[[:Thai:]&[:LineBreak=SA:]&[:M:]]");
  UnicodeString::UnicodeString(&local_b8,'\x01',&local_c0,-1);
  UnicodeSet::applyPattern(&this->fMarkSet,&local_b8,local_20);
  UnicodeString::~UnicodeString(&local_b8);
  ConstChar16Ptr::~ConstChar16Ptr(&local_c0);
  UnicodeSet::add(&this->fMarkSet,0x20);
  UnicodeSet::operator=(&this->fEndWordSet,&this->fThaiWordSet);
  UnicodeSet::remove(&this->fEndWordSet,(char *)0xe31);
  UnicodeSet::remove(&this->fEndWordSet,(char *)0xe40);
  UnicodeSet::add(&this->fBeginWordSet,0xe01,0xe2e);
  UnicodeSet::add(&this->fBeginWordSet,0xe40,0xe44);
  UnicodeSet::add(&this->fSuffixSet,0xe2f);
  UnicodeSet::add(&this->fSuffixSet,0xe46);
  UnicodeSet::compact(&this->fMarkSet);
  UnicodeSet::compact(&this->fEndWordSet);
  UnicodeSet::compact(&this->fBeginWordSet);
  UnicodeSet::compact(&this->fSuffixSet);
  return;
}

Assistant:

ThaiBreakEngine::ThaiBreakEngine(DictionaryMatcher *adoptDictionary, UErrorCode &status)
    : DictionaryBreakEngine(),
      fDictionary(adoptDictionary)
{
    fThaiWordSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Thai:]&[:LineBreak=SA:]]"), status);
    if (U_SUCCESS(status)) {
        setCharacters(fThaiWordSet);
    }
    fMarkSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Thai:]&[:LineBreak=SA:]&[:M:]]"), status);
    fMarkSet.add(0x0020);
    fEndWordSet = fThaiWordSet;
    fEndWordSet.remove(0x0E31);             // MAI HAN-AKAT
    fEndWordSet.remove(0x0E40, 0x0E44);     // SARA E through SARA AI MAIMALAI
    fBeginWordSet.add(0x0E01, 0x0E2E);      // KO KAI through HO NOKHUK
    fBeginWordSet.add(0x0E40, 0x0E44);      // SARA E through SARA AI MAIMALAI
    fSuffixSet.add(THAI_PAIYANNOI);
    fSuffixSet.add(THAI_MAIYAMOK);

    // Compact for caching.
    fMarkSet.compact();
    fEndWordSet.compact();
    fBeginWordSet.compact();
    fSuffixSet.compact();
}